

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

void lzss_emit_match(rar *rar,int offset,int length)

{
  int iVar1;
  uint uVar2;
  void *__dest;
  void *__src;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uchar *s;
  uchar *d;
  int remaining;
  int li;
  int l;
  int srcoffs;
  int dstoffs;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  local_14 = lzss_current_offset((lzss *)0x26f002);
  local_18 = lzss_mask((lzss *)(in_RDI + 800));
  local_18 = local_14 - in_ESI & local_18;
  local_24 = in_EDX;
  while (0 < local_24) {
    local_1c = local_24;
    if ((int)local_18 < (int)local_14) {
      iVar1 = lzss_size((lzss *)(in_RDI + 800));
      if ((int)(iVar1 - local_14) < local_24) {
        local_1c = lzss_size((lzss *)(in_RDI + 800));
        local_1c = local_1c - local_14;
      }
    }
    else {
      iVar1 = lzss_size((lzss *)(in_RDI + 800));
      if ((int)(iVar1 - local_18) < local_24) {
        local_1c = lzss_size((lzss *)(in_RDI + 800));
        local_1c = local_1c - local_18;
      }
    }
    __dest = (void *)(*(long *)(in_RDI + 800) + (long)(int)local_14);
    __src = (void *)(*(long *)(in_RDI + 800) + (long)(int)local_18);
    if (((int)(local_14 + local_1c) < (int)local_18) || ((int)(local_18 + local_1c) < (int)local_14)
       ) {
      memcpy(__dest,__src,(long)local_1c);
    }
    else {
      for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
        *(undefined1 *)((long)__dest + (long)local_20) =
             *(undefined1 *)((long)__src + (long)local_20);
      }
    }
    local_24 = local_24 - local_1c;
    uVar2 = lzss_mask((lzss *)(in_RDI + 800));
    local_14 = local_14 + local_1c & uVar2;
    uVar2 = lzss_mask((lzss *)(in_RDI + 800));
    local_18 = local_18 + local_1c & uVar2;
  }
  *(long *)(in_RDI + 0x330) = (long)in_EDX + *(long *)(in_RDI + 0x330);
  return;
}

Assistant:

static inline void
lzss_emit_match(struct rar *rar, int offset, int length)
{
  int dstoffs = lzss_current_offset(&rar->lzss);
  int srcoffs = (dstoffs - offset) & lzss_mask(&rar->lzss);
  int l, li, remaining;
  unsigned char *d, *s;

  remaining = length;
  while (remaining > 0) {
    l = remaining;
    if (dstoffs > srcoffs) {
      if (l > lzss_size(&rar->lzss) - dstoffs)
        l = lzss_size(&rar->lzss) - dstoffs;
    } else {
      if (l > lzss_size(&rar->lzss) - srcoffs)
        l = lzss_size(&rar->lzss) - srcoffs;
    }
    d = &(rar->lzss.window[dstoffs]);
    s = &(rar->lzss.window[srcoffs]);
    if ((dstoffs + l < srcoffs) || (srcoffs + l < dstoffs))
      memcpy(d, s, l);
    else {
      for (li = 0; li < l; li++)
        d[li] = s[li];
    }
    remaining -= l;
    dstoffs = (dstoffs + l) & lzss_mask(&(rar->lzss));
    srcoffs = (srcoffs + l) & lzss_mask(&(rar->lzss));
  }
  rar->lzss.position += length;
}